

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProps.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  SimInfo *__args_4;
  pointer pDVar2;
  int order_2;
  int order_1;
  int order;
  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_> corrFunc;
  RealType maxLen;
  SimInfo *info;
  SimCreator creator;
  int privilegedAxis;
  char *sele2Env;
  char *sele1Env;
  string sele2;
  string sele1;
  string dumpFileName;
  gengetopt_args_info args_info;
  undefined1 in_stack_00010307;
  string *in_stack_00010308;
  SimCreator *in_stack_00010310;
  string *in_stack_fffffffffffff8d8;
  DynamicProperty *in_stack_fffffffffffff8e0;
  unique_ptr<OpenMD::AngularVelVelOutProdCorrFunc,_std::default_delete<OpenMD::AngularVelVelOutProdCorrFunc>_>
  *in_stack_fffffffffffff8e8;
  unique_ptr<OpenMD::ChargeOrientationCorrFunc,_std::default_delete<OpenMD::ChargeOrientationCorrFunc>_>
  *__u;
  unique_ptr<OpenMD::HBondJumpZ,_std::default_delete<OpenMD::HBondJumpZ>_> *__u_00;
  unique_ptr<OpenMD::HBondJumpR,_std::default_delete<OpenMD::HBondJumpR>_> *__u_01;
  __uniq_ptr_impl<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
  *in_stack_fffffffffffff8f0;
  double *in_stack_fffffffffffff8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  SimInfo **in_stack_fffffffffffff928;
  double *in_stack_fffffffffffff930;
  double *in_stack_fffffffffffff938;
  errorStruct *in_stack_fffffffffffff940;
  double *in_stack_fffffffffffff948;
  errorStruct *peVar4;
  int *__args_7;
  undefined4 in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  SimInfo **in_stack_fffffffffffff978;
  string local_680 [16];
  undefined8 in_stack_fffffffffffff990;
  double *in_stack_fffffffffffff998;
  double *in_stack_fffffffffffff9a0;
  double *in_stack_fffffffffffff9a8;
  int *in_stack_fffffffffffff9b0;
  string local_5b4 [5];
  __uniq_ptr_impl<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_> local_4f8;
  SimInfo *local_4f0;
  int local_4e8 [11];
  undefined1 local_4bc [20];
  string local_4a8 [32];
  string local_488 [55];
  undefined1 local_451 [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  char *local_408;
  char *local_3f0;
  char *local_3d8;
  string local_390;
  undefined1 local_360 [48];
  undefined1 local_330 [24];
  undefined1 local_318 [24];
  DynamicProperty local_300;
  _Head_base<0UL,_OpenMD::DynamicProperty_*,_false> local_2d0;
  undefined1 local_2a0 [48];
  int local_270;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_4;
  
  local_4 = 0;
  iVar1 = cmdline_parser((int)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                         (char **)in_stack_fffffffffffff8d8,(gengetopt_args_info *)0x14b08d);
  if (iVar1 != 0) {
    cmdline_parser_print_help();
    exit(1);
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_451;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918,
             (allocator<char> *)in_stack_fffffffffffff910);
  std::allocator<char>::~allocator((allocator<char> *)local_451);
  std::__cxx11::string::string(local_488);
  std::__cxx11::string::string(local_4a8);
  if (local_108 == 0) {
    local_4bc._12_8_ = getenv("SELECTION1");
    if ((char *)local_4bc._12_8_ == (char *)0x0) {
      std::__cxx11::string::operator=(local_488,"select all");
      __args_2 = local_420;
    }
    else {
      std::__cxx11::string::operator=(local_488,(char *)local_4bc._12_8_);
      __args_2 = local_420;
    }
  }
  else {
    std::__cxx11::string::operator=(local_488,local_3f0);
    __args_2 = local_420;
  }
  if (local_104 == 0) {
    local_4bc._4_8_ = getenv("SELECTION2");
    if ((char *)local_4bc._4_8_ == (char *)0x0) {
      std::__cxx11::string::operator=(local_4a8,local_488);
    }
    else {
      std::__cxx11::string::operator=(local_4a8,(char *)local_4bc._4_8_);
    }
  }
  else {
    std::__cxx11::string::operator=(local_4a8,local_3d8);
  }
  if (local_300.outputFilename_.field_2._M_allocated_capacity._0_4_ == 0) {
    local_4bc._0_4_ = 0;
  }
  else if (local_300.outputFilename_.field_2._M_allocated_capacity._0_4_ == 1) {
    local_4bc._0_4_ = 1;
  }
  else {
    local_4bc._0_4_ = 2;
  }
  __args_7 = local_4e8;
  OpenMD::SimCreator::SimCreator((SimCreator *)0x14b2a2);
  __args_4 = OpenMD::SimCreator::createSim
                       (in_stack_00010310,in_stack_00010308,(bool)in_stack_00010307);
  if (local_d8 == 0) {
    local_4f8._M_t.
    super__Tuple_impl<0UL,_OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>
    .super__Head_base<0UL,_OpenMD::DynamicProperty_*,_false>._M_head_impl =
         (tuple<OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>)
         (_Tuple_impl<0UL,_OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>
         )0x4059000000000000;
  }
  else {
    local_4f8._M_t.
    super__Tuple_impl<0UL,_OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>
    .super__Head_base<0UL,_OpenMD::DynamicProperty_*,_false>._M_head_impl =
         (tuple<OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>)
         (tuple<OpenMD::DynamicProperty_*,_std::default_delete<OpenMD::DynamicProperty>_>)
         local_2d0._M_head_impl;
  }
  local_4f0 = __args_4;
  std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
  unique_ptr<std::default_delete<OpenMD::DynamicProperty>,void>
            ((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_> *)
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  if (local_88 == 0) {
    if (local_c4 == 0) {
      if (local_98 == 0) {
        if (local_c0 == 0) {
          if (local_84 == 0) {
            if (local_80 == 0) {
              if (local_7c == 0) {
                if (local_bc == 0) {
                  if (local_b8 == 0) {
                    if (local_b4 == 0) {
                      if (local_b0 == 0) {
                        if (local_9c == 0) {
                          if (local_5c == 0) {
                            if (local_58 == 0) {
                              if (local_54 == 0) {
                                if (local_50 == 0) {
                                  if (local_4c == 0) {
                                    if (local_48 == 0) {
                                      if (local_44 == 0) {
                                        if (local_74 == 0) {
                                          if (local_78 == 0) {
                                            if (local_70 == 0) {
                                              if (local_94 == 0) {
                                                if (local_90 == 0) {
                                                  if (local_8c == 0) {
                                                    if (local_6c == 0) {
                                                      if (local_68 == 0) {
                                                        if (local_64 == 0) {
                                                          if (local_60 == 0) {
                                                            if (local_40 == 0) {
                                                              if (local_3c == 0) {
                                                                if (local_38 == 0) {
                                                                  if (local_34 == 0) {
                                                                    if (local_30 == 0) {
                                                                      if (local_ac == 0) {
                                                                        if (local_a8 == 0) {
                                                                          if (local_a4 == 0) {
                                                                            if (local_a0 == 0) {
                                                                              if (local_2c == 0) {
                                                                                if (local_28 != 0) {
                                                                                  std::
                                                  make_unique<OpenMD::MeanDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::MeanDisplacement,_std::default_delete<OpenMD::MeanDisplacement>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::MeanDisplacement,_std::default_delete<OpenMD::MeanDisplacement>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::MeanDisplacement,_std::default_delete<OpenMD::MeanDisplacement>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::RotAngleDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::RotAngleDisplacement,_std::default_delete<OpenMD::RotAngleDisplacement>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::RotAngleDisplacement,_std::default_delete<OpenMD::RotAngleDisplacement>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::RotAngleDisplacement,_std::default_delete<OpenMD::RotAngleDisplacement>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::AngularVelVelOutProdCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::AngularVelVelOutProdCorrFunc,_std::default_delete<OpenMD::AngularVelVelOutProdCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::AngularVelVelOutProdCorrFunc,_std::default_delete<OpenMD::AngularVelVelOutProdCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::VelAngularVelOutProdCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::VelAngularVelOutProdCorrFunc,_std::default_delete<OpenMD::VelAngularVelOutProdCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::VelAngularVelOutProdCorrFunc,_std::default_delete<OpenMD::VelAngularVelOutProdCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::VelAngularVelOutProdCorrFunc,_std::default_delete<OpenMD::VelAngularVelOutProdCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::AngularVelocityAutoOutProductCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::AngularVelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::AngularVelocityAutoOutProductCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::AngularVelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::AngularVelocityAutoOutProductCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::AngularVelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::AngularVelocityAutoOutProductCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::VelocityAutoOutProductCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::VelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::VelocityAutoOutProductCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::VelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::VelocityAutoOutProductCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::VelocityAutoOutProductCorrFunc,_std::default_delete<OpenMD::VelocityAutoOutProductCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::CollectiveDipoleDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::CollectiveDipoleDisplacement,_std::default_delete<OpenMD::CollectiveDipoleDisplacement>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::CollectiveDipoleDisplacement,_std::default_delete<OpenMD::CollectiveDipoleDisplacement>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::CollectiveDipoleDisplacement,_std::default_delete<OpenMD::CollectiveDipoleDisplacement>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else if (local_108 == 0) {
                                                    peVar4 = &painCave;
                                                    snprintf(painCave.errMsg,2000,
                                                                                                                          
                                                  "--sele1 must be set for Center of Mass Rcorr\n");
                                                  peVar4->severity = 1;
                                                  peVar4->isFatal = 1;
                                                  simError();
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::OnsagerCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::OnsagerCorrFunc,_std::default_delete<OpenMD::OnsagerCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::OnsagerCorrFunc,_std::default_delete<OpenMD::OnsagerCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::OnsagerCorrFunc,_std::default_delete<OpenMD::OnsagerCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::CurrentDensityAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::CurrentDensityAutoCorrFunc,_std::default_delete<OpenMD::CurrentDensityAutoCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::CurrentDensityAutoCorrFunc,_std::default_delete<OpenMD::CurrentDensityAutoCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::CurrentDensityAutoCorrFunc,_std::default_delete<OpenMD::CurrentDensityAutoCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff8d8 = (string *)local_4bc;
                                                    std::
                                                  make_unique<OpenMD::DisplacementZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                                                            (in_stack_fffffffffffff928,
                                                             in_stack_fffffffffffff920,
                                                             in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             (int *)in_stack_fffffffffffff908,
                                                             (int *)in_stack_fffffffffffff940);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::DisplacementZ,_std::default_delete<OpenMD::DisplacementZ>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::DisplacementZ,_std::default_delete<OpenMD::DisplacementZ>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::DisplacementZ,_std::default_delete<OpenMD::DisplacementZ>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::Displacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::Displacement,_std::default_delete<OpenMD::Displacement>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::Displacement,_std::default_delete<OpenMD::Displacement>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::Displacement,_std::default_delete<OpenMD::Displacement>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff8d8 = (string *)local_318;
                                                    in_stack_fffffffffffff8e0 =
                                                         (DynamicProperty *)(local_318 + 0x18);
                                                    std::
                                                  make_unique<OpenMD::HBondPersistence,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900,
                                                             in_stack_fffffffffffff8f8,
                                                             in_stack_fffffffffffff930,
                                                             in_stack_fffffffffffff938);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::HBondPersistence,_std::default_delete<OpenMD::HBondPersistence>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::HBondPersistence,_std::default_delete<OpenMD::HBondPersistence>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::HBondPersistence,_std::default_delete<OpenMD::HBondPersistence>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else if (local_100 == 0) {
                                                    peVar4 = &painCave;
                                                    snprintf(painCave.errMsg,2000,
                                                                                                                          
                                                  "--sele3 must be set if --jumptimeR is set\n");
                                                  peVar4->severity = 1;
                                                  peVar4->isFatal = 1;
                                                  simError();
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff8d8 = (string *)local_330;
                                                    in_stack_fffffffffffff8e0 =
                                                         (DynamicProperty *)local_318;
                                                    __u_01 = (
                                                  unique_ptr<OpenMD::HBondJumpR,_std::default_delete<OpenMD::HBondJumpR>_>
                                                  *)(local_318 + 0x18);
                                                  in_stack_fffffffffffff8f0 = &local_4f8;
                                                  std::
                                                  make_unique<OpenMD::HBondJumpR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char*&,double&,double&,double&,double&,int&>
                                                            (in_stack_fffffffffffff978,pbVar3,
                                                             __args_2,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(local_300.outputFilename_.field_2.
                                                             _M_allocated_capacity._0_4_,
                                                             in_stack_fffffffffffff960),
                                                  (char **)__args_4,
                                                  (double *)in_stack_fffffffffffff990,
                                                  in_stack_fffffffffffff998,
                                                  in_stack_fffffffffffff9a0,
                                                  in_stack_fffffffffffff9a8,
                                                  in_stack_fffffffffffff9b0);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,__u_01);
                                                  std::
                                                  unique_ptr<OpenMD::HBondJumpR,_std::default_delete<OpenMD::HBondJumpR>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::HBondJumpR,_std::default_delete<OpenMD::HBondJumpR>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff8d8 = (string *)local_318;
                                                    in_stack_fffffffffffff8e0 =
                                                         (DynamicProperty *)(local_318 + 0x18);
                                                    __u_00 = (
                                                  unique_ptr<OpenMD::HBondJumpZ,_std::default_delete<OpenMD::HBondJumpZ>_>
                                                  *)local_360;
                                                  in_stack_fffffffffffff8f0 =
                                                       (
                                                  __uniq_ptr_impl<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)local_4bc;
                                                  std::
                                                  make_unique<OpenMD::HBondJumpZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,int&,int&>
                                                            (in_stack_fffffffffffff928,
                                                             in_stack_fffffffffffff920,
                                                             in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             (double *)in_stack_fffffffffffff908,
                                                             (double *)in_stack_fffffffffffff940,
                                                             in_stack_fffffffffffff948,__args_7,
                                                             (int *)__args_4);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,__u_00);
                                                  std::
                                                  unique_ptr<OpenMD::HBondJumpZ,_std::default_delete<OpenMD::HBondJumpZ>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::HBondJumpZ,_std::default_delete<OpenMD::HBondJumpZ>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff8d8 = (string *)local_318;
                                                    in_stack_fffffffffffff8e0 =
                                                         (DynamicProperty *)(local_318 + 0x18);
                                                    std::
                                                  make_unique<OpenMD::HBondJump,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900,
                                                             in_stack_fffffffffffff8f8,
                                                             in_stack_fffffffffffff930,
                                                             in_stack_fffffffffffff938);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::HBondJump,_std::default_delete<OpenMD::HBondJump>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::HBondJump,_std::default_delete<OpenMD::HBondJump>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::HBondJump,_std::default_delete<OpenMD::HBondJump>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                  }
                                                  else {
                                                    if (local_f8 == 0) {
                                                      peVar4 = &painCave;
                                                      snprintf(painCave.errMsg,2000,
                                                                                                                              
                                                  "--order must be set if --cohZ is set\n");
                                                  peVar4->severity = 1;
                                                  peVar4->isFatal = 1;
                                                  simError();
                                                  }
                                                  in_stack_fffffffffffff8d8 = (string *)local_360;
                                                  in_stack_fffffffffffff8e0 =
                                                       (DynamicProperty *)local_4bc;
                                                  std::
                                                  make_unique<OpenMD::COHZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&,int&>
                                                            (in_stack_fffffffffffff928,
                                                             in_stack_fffffffffffff920,
                                                             in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             (int *)in_stack_fffffffffffff908,
                                                             (int *)in_stack_fffffffffffff940,
                                                             (int *)in_stack_fffffffffffff948);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::COHZ,_std::default_delete<OpenMD::COHZ>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::COHZ,_std::default_delete<OpenMD::COHZ>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::COHZ,_std::default_delete<OpenMD::COHZ>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                  }
                                                }
                                                else {
                                                  if (local_f8 == 0) {
                                                    in_stack_fffffffffffff940 = &painCave;
                                                    snprintf(painCave.errMsg,2000,
                                                                                                                          
                                                  "--order must be set if --lcorrZ is set\n");
                                                  in_stack_fffffffffffff940->severity = 1;
                                                  in_stack_fffffffffffff940->isFatal = 1;
                                                  simError();
                                                  }
                                                  in_stack_fffffffffffff8d8 = (string *)local_360;
                                                  in_stack_fffffffffffff8e0 =
                                                       (DynamicProperty *)local_4bc;
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&,int&>
                                                            (in_stack_fffffffffffff928,
                                                             in_stack_fffffffffffff920,
                                                             in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             (int *)in_stack_fffffffffffff908,
                                                             (int *)in_stack_fffffffffffff940,
                                                             (int *)in_stack_fffffffffffff948);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::LegendreCorrFuncZ,_std::default_delete<OpenMD::LegendreCorrFuncZ>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::LegendreCorrFuncZ,_std::default_delete<OpenMD::LegendreCorrFuncZ>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::LegendreCorrFuncZ,_std::default_delete<OpenMD::LegendreCorrFuncZ>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                }
                                              }
                                              else {
                                                local_5b4[0]._M_dataplus = (_Alloc_hider)0x0;
                                                local_5b4[0]._1_3_ = 0;
                                                if (local_f8 == 0) {
                                                  peVar4 = &painCave;
                                                  snprintf(painCave.errMsg,2000,
                                                           "--order must be set if --lcorr is set\n"
                                                          );
                                                  peVar4->severity = 1;
                                                  peVar4->isFatal = 1;
                                                  simError();
                                                }
                                                else {
                                                  local_5b4[0]._M_dataplus = local_390._M_dataplus;
                                                  local_5b4[0]._1_3_ = local_390._1_3_;
                                                }
                                                if (local_fc == 0) {
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
                                                            ((SimInfo **)in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             in_stack_fffffffffffff908,
                                                             in_stack_fffffffffffff900,
                                                             (int *)in_stack_fffffffffffff8f8);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                }
                                                else {
                                                  in_stack_fffffffffffff8d8 = local_5b4;
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                                                            (in_stack_fffffffffffff928,
                                                             in_stack_fffffffffffff920,
                                                             in_stack_fffffffffffff918,
                                                             in_stack_fffffffffffff910,
                                                             (int *)in_stack_fffffffffffff908,
                                                             (int *)in_stack_fffffffffffff940);
                                                  std::
                                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                                  ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                                  std::
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<OpenMD::LegendreCorrFunc,_std::default_delete<OpenMD::LegendreCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                                }
                                              }
                                            }
                                            else {
                                              std::
                                              make_unique<OpenMD::FreqFlucCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                        ((SimInfo **)in_stack_fffffffffffff918,
                                                         in_stack_fffffffffffff910,
                                                         in_stack_fffffffffffff908,
                                                         in_stack_fffffffffffff900);
                                              std::
                                              unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                              ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::FreqFlucCorrFunc,_std::default_delete<OpenMD::FreqFlucCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                              std::
                                              unique_ptr<OpenMD::FreqFlucCorrFunc,_std::default_delete<OpenMD::FreqFlucCorrFunc>_>
                                              ::~unique_ptr((
                                                  unique_ptr<OpenMD::FreqFlucCorrFunc,_std::default_delete<OpenMD::FreqFlucCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                            }
                                          }
                                          else {
                                            std::
                                            make_unique<OpenMD::StressCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                      ((SimInfo **)in_stack_fffffffffffff918,
                                                       in_stack_fffffffffffff910,
                                                       in_stack_fffffffffffff908,
                                                       in_stack_fffffffffffff900);
                                            std::
                                            unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                            ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::StressCorrFunc,_std::default_delete<OpenMD::StressCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                            std::
                                            unique_ptr<OpenMD::StressCorrFunc,_std::default_delete<OpenMD::StressCorrFunc>_>
                                            ::~unique_ptr((
                                                  unique_ptr<OpenMD::StressCorrFunc,_std::default_delete<OpenMD::StressCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                          }
                                        }
                                        else {
                                          std::
                                          make_unique<OpenMD::BondCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                    ((SimInfo **)in_stack_fffffffffffff918,
                                                     in_stack_fffffffffffff910,
                                                     in_stack_fffffffffffff908,
                                                     in_stack_fffffffffffff900);
                                          std::
                                          unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                          ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::BondCorrFunc,_std::default_delete<OpenMD::BondCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                          std::
                                          unique_ptr<OpenMD::BondCorrFunc,_std::default_delete<OpenMD::BondCorrFunc>_>
                                          ::~unique_ptr((
                                                  unique_ptr<OpenMD::BondCorrFunc,_std::default_delete<OpenMD::BondCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                        }
                                      }
                                      else {
                                        std::
                                        make_unique<OpenMD::TorqueAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                  ((SimInfo **)in_stack_fffffffffffff918,
                                                   in_stack_fffffffffffff910,
                                                   in_stack_fffffffffffff908,
                                                   in_stack_fffffffffffff900);
                                        std::
                                        unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                        ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::TorqueAutoCorrFunc,_std::default_delete<OpenMD::TorqueAutoCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                        std::
                                        unique_ptr<OpenMD::TorqueAutoCorrFunc,_std::default_delete<OpenMD::TorqueAutoCorrFunc>_>
                                        ::~unique_ptr((
                                                  unique_ptr<OpenMD::TorqueAutoCorrFunc,_std::default_delete<OpenMD::TorqueAutoCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                      }
                                    }
                                    else {
                                      std::
                                      make_unique<OpenMD::TorForCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                ((SimInfo **)in_stack_fffffffffffff918,
                                                 in_stack_fffffffffffff910,in_stack_fffffffffffff908
                                                 ,in_stack_fffffffffffff900);
                                      std::
                                      unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                      ::operator=((
                                                  unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                  *)in_stack_fffffffffffff8f0,
                                                  (
                                                  unique_ptr<OpenMD::TorForCorrFunc,_std::default_delete<OpenMD::TorForCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e8);
                                      std::
                                      unique_ptr<OpenMD::TorForCorrFunc,_std::default_delete<OpenMD::TorForCorrFunc>_>
                                      ::~unique_ptr((
                                                  unique_ptr<OpenMD::TorForCorrFunc,_std::default_delete<OpenMD::TorForCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                    }
                                  }
                                  else {
                                    std::
                                    make_unique<OpenMD::ForceAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                              ((SimInfo **)in_stack_fffffffffffff918,
                                               in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                               in_stack_fffffffffffff900);
                                    std::
                                    unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                    ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                                 *)in_stack_fffffffffffff8f0,
                                                (unique_ptr<OpenMD::ForceAutoCorrFunc,_std::default_delete<OpenMD::ForceAutoCorrFunc>_>
                                                 *)in_stack_fffffffffffff8e8);
                                    std::
                                    unique_ptr<OpenMD::ForceAutoCorrFunc,_std::default_delete<OpenMD::ForceAutoCorrFunc>_>
                                    ::~unique_ptr((
                                                  unique_ptr<OpenMD::ForceAutoCorrFunc,_std::default_delete<OpenMD::ForceAutoCorrFunc>_>
                                                  *)in_stack_fffffffffffff8e0);
                                  }
                                }
                                else if (((local_d4 != 0) && (local_d0 != 0)) && (local_cc != 0)) {
                                  in_stack_fffffffffffff8d8 = (string *)local_2a0;
                                  in_stack_fffffffffffff8e0 = (DynamicProperty *)(local_2a0 + 0x18);
                                  __u = (unique_ptr<OpenMD::ChargeOrientationCorrFunc,_std::default_delete<OpenMD::ChargeOrientationCorrFunc>_>
                                         *)(local_360 + 0x18);
                                  std::
                                  make_unique<OpenMD::ChargeOrientationCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,double&>
                                            ((SimInfo **)in_stack_fffffffffffff918,
                                             in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                             in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                             in_stack_fffffffffffff930,in_stack_fffffffffffff938,
                                             (double *)in_stack_fffffffffffff940);
                                  std::
                                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                  ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                               *)in_stack_fffffffffffff8f0,__u);
                                  std::
                                  unique_ptr<OpenMD::ChargeOrientationCorrFunc,_std::default_delete<OpenMD::ChargeOrientationCorrFunc>_>
                                  ::~unique_ptr((unique_ptr<OpenMD::ChargeOrientationCorrFunc,_std::default_delete<OpenMD::ChargeOrientationCorrFunc>_>
                                                 *)in_stack_fffffffffffff8e0);
                                }
                              }
                              else {
                                std::
                                make_unique<OpenMD::ChargeKineticCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&>
                                          ((SimInfo **)in_stack_fffffffffffff918,
                                           in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                           in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
                                std::
                                unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                                ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                             *)in_stack_fffffffffffff8f0,
                                            (unique_ptr<OpenMD::ChargeKineticCorrFunc,_std::default_delete<OpenMD::ChargeKineticCorrFunc>_>
                                             *)in_stack_fffffffffffff8e8);
                                std::
                                unique_ptr<OpenMD::ChargeKineticCorrFunc,_std::default_delete<OpenMD::ChargeKineticCorrFunc>_>
                                ::~unique_ptr((unique_ptr<OpenMD::ChargeKineticCorrFunc,_std::default_delete<OpenMD::ChargeKineticCorrFunc>_>
                                               *)in_stack_fffffffffffff8e0);
                              }
                            }
                            else {
                              std::
                              make_unique<OpenMD::ForTorCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                        ((SimInfo **)in_stack_fffffffffffff918,
                                         in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                         in_stack_fffffffffffff900);
                              std::
                              unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                              ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                           *)in_stack_fffffffffffff8f0,
                                          (unique_ptr<OpenMD::ForTorCorrFunc,_std::default_delete<OpenMD::ForTorCorrFunc>_>
                                           *)in_stack_fffffffffffff8e8);
                              std::
                              unique_ptr<OpenMD::ForTorCorrFunc,_std::default_delete<OpenMD::ForTorCorrFunc>_>
                              ::~unique_ptr((unique_ptr<OpenMD::ForTorCorrFunc,_std::default_delete<OpenMD::ForTorCorrFunc>_>
                                             *)in_stack_fffffffffffff8e0);
                            }
                          }
                          else {
                            std::
                            make_unique<OpenMD::MomAngMomCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                      ((SimInfo **)in_stack_fffffffffffff918,
                                       in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                       in_stack_fffffffffffff900);
                            std::
                            unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                            ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                         *)in_stack_fffffffffffff8f0,
                                        (unique_ptr<OpenMD::MomAngMomCorrFunc,_std::default_delete<OpenMD::MomAngMomCorrFunc>_>
                                         *)in_stack_fffffffffffff8e8);
                            std::
                            unique_ptr<OpenMD::MomAngMomCorrFunc,_std::default_delete<OpenMD::MomAngMomCorrFunc>_>
                            ::~unique_ptr((unique_ptr<OpenMD::MomAngMomCorrFunc,_std::default_delete<OpenMD::MomAngMomCorrFunc>_>
                                           *)in_stack_fffffffffffff8e0);
                          }
                        }
                        else {
                          std::
                          make_unique<OpenMD::WCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                    ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910
                                     ,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                          std::
                          unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                          ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                       *)in_stack_fffffffffffff8f0,
                                      (unique_ptr<OpenMD::WCorrFunc,_std::default_delete<OpenMD::WCorrFunc>_>
                                       *)in_stack_fffffffffffff8e8);
                          std::
                          unique_ptr<OpenMD::WCorrFunc,_std::default_delete<OpenMD::WCorrFunc>_>::
                          ~unique_ptr((unique_ptr<OpenMD::WCorrFunc,_std::default_delete<OpenMD::WCorrFunc>_>
                                       *)in_stack_fffffffffffff8e0);
                        }
                      }
                      else {
                        std::
                        make_unique<OpenMD::VCorrFuncR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                  ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                                   in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                        std::
                        unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                        ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                     *)in_stack_fffffffffffff8f0,
                                    (unique_ptr<OpenMD::VCorrFuncR,_std::default_delete<OpenMD::VCorrFuncR>_>
                                     *)in_stack_fffffffffffff8e8);
                        std::
                        unique_ptr<OpenMD::VCorrFuncR,_std::default_delete<OpenMD::VCorrFuncR>_>::
                        ~unique_ptr((unique_ptr<OpenMD::VCorrFuncR,_std::default_delete<OpenMD::VCorrFuncR>_>
                                     *)in_stack_fffffffffffff8e0);
                      }
                    }
                    else {
                      std::
                      make_unique<OpenMD::VCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                                 in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                      std::
                      unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                      ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                   *)in_stack_fffffffffffff8f0,
                                  (unique_ptr<OpenMD::VCorrFuncZ,_std::default_delete<OpenMD::VCorrFuncZ>_>
                                   *)in_stack_fffffffffffff8e8);
                      std::unique_ptr<OpenMD::VCorrFuncZ,_std::default_delete<OpenMD::VCorrFuncZ>_>
                      ::~unique_ptr((unique_ptr<OpenMD::VCorrFuncZ,_std::default_delete<OpenMD::VCorrFuncZ>_>
                                     *)in_stack_fffffffffffff8e0);
                    }
                  }
                  else {
                    std::
                    make_unique<OpenMD::VCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                              ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                               in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                    std::
                    unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
                    ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                                 *)in_stack_fffffffffffff8f0,
                                (unique_ptr<OpenMD::VCorrFunc,_std::default_delete<OpenMD::VCorrFunc>_>
                                 *)in_stack_fffffffffffff8e8);
                    std::unique_ptr<OpenMD::VCorrFunc,_std::default_delete<OpenMD::VCorrFunc>_>::
                    ~unique_ptr((unique_ptr<OpenMD::VCorrFunc,_std::default_delete<OpenMD::VCorrFunc>_>
                                 *)in_stack_fffffffffffff8e0);
                  }
                }
                else {
                  in_stack_fffffffffffff8d8 = (string *)local_4bc;
                  std::
                  make_unique<OpenMD::RCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                             in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                             (int *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff940);
                  std::
                  unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
                  operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                             *)in_stack_fffffffffffff8f0,
                            (unique_ptr<OpenMD::RCorrFuncZ,_std::default_delete<OpenMD::RCorrFuncZ>_>
                             *)in_stack_fffffffffffff8e8);
                  std::unique_ptr<OpenMD::RCorrFuncZ,_std::default_delete<OpenMD::RCorrFuncZ>_>::
                  ~unique_ptr((unique_ptr<OpenMD::RCorrFuncZ,_std::default_delete<OpenMD::RCorrFuncZ>_>
                               *)in_stack_fffffffffffff8e0);
                }
              }
              else {
                std::
                make_unique<OpenMD::DirectionalRCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                           in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                std::
                unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
                operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                           *)in_stack_fffffffffffff8f0,
                          (unique_ptr<OpenMD::DirectionalRCorrFunc,_std::default_delete<OpenMD::DirectionalRCorrFunc>_>
                           *)in_stack_fffffffffffff8e8);
                std::
                unique_ptr<OpenMD::DirectionalRCorrFunc,_std::default_delete<OpenMD::DirectionalRCorrFunc>_>
                ::~unique_ptr((unique_ptr<OpenMD::DirectionalRCorrFunc,_std::default_delete<OpenMD::DirectionalRCorrFunc>_>
                               *)in_stack_fffffffffffff8e0);
              }
            }
            else {
              std::
              make_unique<OpenMD::ThetaCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                        ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                         in_stack_fffffffffffff908,in_stack_fffffffffffff900);
              std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>
              ::operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                           *)in_stack_fffffffffffff8f0,
                          (unique_ptr<OpenMD::ThetaCorrFunc,_std::default_delete<OpenMD::ThetaCorrFunc>_>
                           *)in_stack_fffffffffffff8e8);
              std::unique_ptr<OpenMD::ThetaCorrFunc,_std::default_delete<OpenMD::ThetaCorrFunc>_>::
              ~unique_ptr((unique_ptr<OpenMD::ThetaCorrFunc,_std::default_delete<OpenMD::ThetaCorrFunc>_>
                           *)in_stack_fffffffffffff8e0);
            }
          }
          else {
            std::
            make_unique<OpenMD::RCorrFuncR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                      ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                       in_stack_fffffffffffff908,in_stack_fffffffffffff900);
            std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
            operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                       *)in_stack_fffffffffffff8f0,
                      (unique_ptr<OpenMD::RCorrFuncR,_std::default_delete<OpenMD::RCorrFuncR>_> *)
                      in_stack_fffffffffffff8e8);
            std::unique_ptr<OpenMD::RCorrFuncR,_std::default_delete<OpenMD::RCorrFuncR>_>::
            ~unique_ptr((unique_ptr<OpenMD::RCorrFuncR,_std::default_delete<OpenMD::RCorrFuncR>_> *)
                        in_stack_fffffffffffff8e0);
          }
        }
        else {
          std::
          make_unique<OpenMD::RCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                    ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                     in_stack_fffffffffffff908,in_stack_fffffffffffff900);
          std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
          operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                     *)in_stack_fffffffffffff8f0,
                    (unique_ptr<OpenMD::RCorrFunc,_std::default_delete<OpenMD::RCorrFunc>_> *)
                    in_stack_fffffffffffff8e8);
          std::unique_ptr<OpenMD::RCorrFunc,_std::default_delete<OpenMD::RCorrFunc>_>::~unique_ptr
                    ((unique_ptr<OpenMD::RCorrFunc,_std::default_delete<OpenMD::RCorrFunc>_> *)
                     in_stack_fffffffffffff8e0);
        }
      }
      else {
        std::
        make_unique<OpenMD::DipoleCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                  ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                   in_stack_fffffffffffff908,in_stack_fffffffffffff900);
        std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
        operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                   *)in_stack_fffffffffffff8f0,
                  (unique_ptr<OpenMD::DipoleCorrFunc,_std::default_delete<OpenMD::DipoleCorrFunc>_>
                   *)in_stack_fffffffffffff8e8);
        std::unique_ptr<OpenMD::DipoleCorrFunc,_std::default_delete<OpenMD::DipoleCorrFunc>_>::
        ~unique_ptr((unique_ptr<OpenMD::DipoleCorrFunc,_std::default_delete<OpenMD::DipoleCorrFunc>_>
                     *)in_stack_fffffffffffff8e0);
      }
    }
    else {
      std::
      make_unique<OpenMD::SelectionCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::
      operator=((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                 *)in_stack_fffffffffffff8f0,
                (unique_ptr<OpenMD::SelectionCorrFunc,_std::default_delete<OpenMD::SelectionCorrFunc>_>
                 *)in_stack_fffffffffffff8e8);
      std::unique_ptr<OpenMD::SelectionCorrFunc,_std::default_delete<OpenMD::SelectionCorrFunc>_>::
      ~unique_ptr((unique_ptr<OpenMD::SelectionCorrFunc,_std::default_delete<OpenMD::SelectionCorrFunc>_>
                   *)in_stack_fffffffffffff8e0);
    }
  }
  else {
    std::
    make_unique<OpenMD::SystemDipoleCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((SimInfo **)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
               in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    std::unique_ptr<OpenMD::DynamicProperty,std::default_delete<OpenMD::DynamicProperty>>::operator=
              ((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_> *
               )in_stack_fffffffffffff8f0,
               (unique_ptr<OpenMD::SystemDipoleCorrFunc,_std::default_delete<OpenMD::SystemDipoleCorrFunc>_>
                *)in_stack_fffffffffffff8e8);
    std::
    unique_ptr<OpenMD::SystemDipoleCorrFunc,_std::default_delete<OpenMD::SystemDipoleCorrFunc>_>::
    ~unique_ptr((unique_ptr<OpenMD::SystemDipoleCorrFunc,_std::default_delete<OpenMD::SystemDipoleCorrFunc>_>
                 *)in_stack_fffffffffffff8e0);
  }
  if (local_270 == 1) {
    pDVar2 = std::unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
             ::operator->((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                           *)0x14c696);
    OpenMD::DynamicProperty::setSelectionModeRestart(pDVar2);
  }
  if (local_10c != 0) {
    pDVar2 = std::unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
             ::operator->((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                           *)0x14c6bd);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffff97f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar3,local_408,(allocator<char> *)pDVar2);
    OpenMD::DynamicProperty::setOutputName(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    std::__cxx11::string::~string(local_680);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff97f);
  }
  pDVar2 = std::unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>::
           operator->((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>
                       *)0x14c780);
  (*pDVar2->_vptr_DynamicProperty[2])();
  if (local_4f0 != (SimInfo *)0x0) {
    (*local_4f0->_vptr_SimInfo[1])();
  }
  local_4 = 0;
  std::unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_>::
  ~unique_ptr((unique_ptr<OpenMD::DynamicProperty,_std::default_delete<OpenMD::DynamicProperty>_> *)
              in_stack_fffffffffffff8f0);
  OpenMD::SimCreator::~SimCreator((SimCreator *)0x14c7d1);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string((string *)(local_451 + 1));
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  struct gengetopt_args_info args_info;

  // parse the command line option

  if (cmdline_parser(argc, argv, &args_info) != 0) {
    cmdline_parser_print_help();
    exit(1);
  }

  // get the dumpfile name and meta-data file name
  std::string dumpFileName = args_info.input_arg;

  std::string sele1;
  std::string sele2;

  // check the first selection argument, or set it to the environment
  // variable, or failing that, set it to "select all"

  if (args_info.sele1_given) {
    sele1 = args_info.sele1_arg;
  } else {
    char* sele1Env = getenv("SELECTION1");
    if (sele1Env) {
      sele1 = sele1Env;
    } else {
      sele1 = "select all";
    }
  }

  // check the second selection argument, or set it to the environment
  // variable, or failing that, set it to the first selection

  if (args_info.sele2_given) {
    sele2 = args_info.sele2_arg;
  } else {
    char* sele2Env = getenv("SELECTION2");
    if (sele2Env) {
      sele2 = sele2Env;
    } else {
      // If sele2 is not specified, then the default behavior
      // should be what is already intended for sele1
      sele2 = sele1;
    }
  }

  // convert privilegedAxis to corresponding integer
  // x axis -> 0
  // y axis -> 1
  // z axis -> 2 (default)

  int privilegedAxis;
  switch (args_info.privilegedAxis_arg) {
  case privilegedAxis_arg_x:
    privilegedAxis = 0;
    break;
  case privilegedAxis_arg_y:
    privilegedAxis = 1;
    break;
  case privilegedAxis_arg_z:
  default:
    privilegedAxis = 2;
    break;
  }

  // use the memory string to figure out how much memory we can use:
  // char *end;
  // long long int memSize = memparse(args_info.memory_arg, &end);

  // We don't really need to print this out anymore:
  // snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
  //           "Amount of memory being used: %llu bytes\n", memSize);
  // painCave.severity = OPENMD_INFO;
  // painCave.isFatal = 0;
  // simError();

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(dumpFileName, false);

  RealType maxLen;
  if (args_info.length_given) {
    maxLen = args_info.length_arg;
  } else {
    maxLen = 100.0;
  }

  std::unique_ptr<DynamicProperty> corrFunc {nullptr};

  if (args_info.sdcorr_given) {
    corrFunc = std::make_unique<SystemDipoleCorrFunc>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.selecorr_given) {
    corrFunc =
        std::make_unique<SelectionCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.dcorr_given) {
    corrFunc =
        std::make_unique<DipoleCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.rcorr_given) {
    corrFunc = std::make_unique<RCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.r_rcorr_given) {
    corrFunc = std::make_unique<RCorrFuncR>(info, dumpFileName, sele1, sele2);
  } else if (args_info.thetacorr_given) {
    corrFunc =
        std::make_unique<ThetaCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.drcorr_given) {
    corrFunc = std::make_unique<DirectionalRCorrFunc>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.rcorrZ_given) {
    corrFunc = std::make_unique<RCorrFuncZ>(
        info, dumpFileName, sele1, sele2, args_info.nzbins_arg, privilegedAxis);
  } else if (args_info.vcorr_given) {
    corrFunc = std::make_unique<VCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.vcorrZ_given) {
    corrFunc = std::make_unique<VCorrFuncZ>(info, dumpFileName, sele1, sele2);
  } else if (args_info.vcorrR_given) {
    corrFunc = std::make_unique<VCorrFuncR>(info, dumpFileName, sele1, sele2);
  } else if (args_info.wcorr_given) {
    corrFunc = std::make_unique<WCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.pjcorr_given) {
    corrFunc =
        std::make_unique<MomAngMomCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.ftcorr_given) {
    corrFunc =
        std::make_unique<ForTorCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.ckcorr_given) {
    corrFunc = std::make_unique<ChargeKineticCorrFunc>(
        info, dumpFileName, sele1, sele2, args_info.rcut_arg);
  } else if (args_info.cscorr_given) {
    if (args_info.dipoleX_given && args_info.dipoleY_given &&
        args_info.dipoleZ_given) {
      corrFunc = std::make_unique<ChargeOrientationCorrFunc>(
          info, dumpFileName, sele1, sele2, args_info.dipoleX_arg,
          args_info.dipoleY_arg, args_info.dipoleZ_arg, args_info.rcut_arg);
    }
  } else if (args_info.facorr_given) {
    corrFunc =
        std::make_unique<ForceAutoCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.tfcorr_given) {
    corrFunc =
        std::make_unique<TorForCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.tacorr_given) {
    corrFunc =
        std::make_unique<TorqueAutoCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.bondcorr_given) {
    corrFunc = std::make_unique<BondCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.stresscorr_given) {
    corrFunc =
        std::make_unique<StressCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.freqfluccorr_given) {
    corrFunc =
        std::make_unique<FreqFlucCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.lcorr_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --lcorr is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (args_info.seleoffset_given) {
      corrFunc = std::make_unique<LegendreCorrFunc>(info, dumpFileName, sele1,
						    sele2,
						    args_info.seleoffset_arg,
						    order);
    } else {
    
      corrFunc = std::make_unique<LegendreCorrFunc>(info, dumpFileName, sele1,
						    sele2, order);
    }
  } else if (args_info.lcorrZ_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --lcorrZ is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    corrFunc = std::make_unique<LegendreCorrFuncZ>(
        info, dumpFileName, sele1, sele2, order, args_info.nzbins_arg,
        privilegedAxis);

  } else if (args_info.cohZ_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --cohZ is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    corrFunc = std::make_unique<COHZ>(info, dumpFileName, sele1, sele2, order,
                                      args_info.nzbins_arg, privilegedAxis);

  } else if (args_info.jumptime_given) {
    corrFunc = std::make_unique<HBondJump>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg);
  } else if (args_info.jumptimeZ_given) {
    corrFunc = std::make_unique<HBondJumpZ>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg, args_info.nzbins_arg,
        privilegedAxis);
  } else if (args_info.jumptimeR_given) {
    if (args_info.sele3_given) {
      corrFunc = std::make_unique<HBondJumpR>(
          info, dumpFileName, sele1, sele2, args_info.sele3_arg,
          args_info.OOcut_arg, args_info.thetacut_arg, args_info.OHcut_arg,
          maxLen, args_info.nbins_arg);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele3 must be set if --jumptimeR is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.persistence_given) {
    corrFunc = std::make_unique<HBondPersistence>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg);
  } else if (args_info.disp_given) {
    corrFunc = std::make_unique<Displacement>(info, dumpFileName, sele1, sele2);
  } else if (args_info.dispZ_given) {
    corrFunc = std::make_unique<DisplacementZ>(
        info, dumpFileName, sele1, sele2, args_info.nzbins_arg, privilegedAxis);
  } else if (args_info.current_given) {
    corrFunc = std::make_unique<CurrentDensityAutoCorrFunc>(info, dumpFileName,
                                                            sele1, sele2);
  } else if (args_info.onsager_given) {
    if (args_info.sele1_given) {
      corrFunc =
          std::make_unique<OnsagerCorrFunc>(info, dumpFileName, sele1, sele2);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele1 must be set for Center of Mass Rcorr\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.ddisp_given) {
    corrFunc = std::make_unique<CollectiveDipoleDisplacement>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.vaOutProdcorr_given) {
    corrFunc = std::make_unique<VelocityAutoOutProductCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.waOutProdcorr_given) {
    corrFunc = std::make_unique<AngularVelocityAutoOutProductCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.vwOutProdcorr_given) {
    corrFunc = std::make_unique<VelAngularVelOutProdCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.wvOutProdcorr_given) {
    corrFunc = std::make_unique<AngularVelVelOutProdCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.rotAngleDisp_given) {
    corrFunc = std::make_unique<RotAngleDisplacement>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.meandisp_given) {
    corrFunc =
        std::make_unique<MeanDisplacement>(info, dumpFileName, sele1, sele2);
  }

  if (args_info.selectionMode_arg == selectionMode_arg_restart) {
    corrFunc->setSelectionModeRestart();
  }
  if (args_info.output_given) { corrFunc->setOutputName(args_info.output_arg); }

  corrFunc->doCorrelate();

  delete info;
  return 0;
}